

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderProgram
          (GLShaderProgram *this,
          vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
          *stages,DrawMode dm,uint nPatchVertices)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  long *plVar6;
  invalid_argument *piVar7;
  size_type *psVar8;
  pointer pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  GLint maxPatchVertices;
  ShaderSpecUniform u;
  uint local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  DataType local_150;
  int iStack_14c;
  pointer local_148;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *local_140;
  pointer local_138;
  pointer local_130;
  ShaderSpecTexture local_128;
  ShaderSpecAttribute local_100;
  ShaderSpecUniform local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ShaderProgram::ShaderProgram(&this->super_ShaderProgram,stages,dm,nPatchVertices);
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_004b8070;
  (this->uniforms).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uniforms).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniforms).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributes).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textures).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).
  super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (*glad_glGetIntegerv)(0x8e7d,(GLint *)&local_174);
  if ((nPatchVertices != 0) && (local_174 < nPatchVertices)) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_90,nPatchVertices);
    std::operator+(&local_50,"Requested number of patch vertices (",&local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar8 = (size_type *)(plVar6 + 2);
    local_b0._M_dataplus._M_p = (pointer)*plVar6;
    if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_70,local_174);
    std::operator+(&local_170,&local_b0,&local_70);
    std::invalid_argument::invalid_argument(piVar7,(string *)&local_170);
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_138 = (stages->
              super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  pSVar5 = (stages->
           super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_140 = stages;
  if (pSVar5 != local_138) {
    paVar1 = &local_170.field_2;
    do {
      pSVar9 = (pSVar5->uniforms).
               super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_130 = (pSVar5->uniforms).
                  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_148 = pSVar5;
      if (pSVar9 != local_130) {
        do {
          pcVar2 = (pSVar9->name)._M_dataplus._M_p;
          local_170._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,pcVar2,pcVar2 + (pSVar9->name)._M_string_length);
          local_150 = pSVar9->type;
          local_d8.name._M_dataplus._M_p = (pointer)&local_d8.name.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          local_d8.type = local_150;
          addUniqueUniform(this,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
            operator_delete(local_d8.name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != paVar1) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          pSVar9 = pSVar9 + 1;
        } while (pSVar9 != local_130);
      }
      pSVar3 = (local_148->attributes).
               super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar10 = (local_148->attributes).
                     super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar10 != pSVar3;
          pSVar10 = pSVar10 + 1) {
        pcVar2 = (pSVar10->name)._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar2,pcVar2 + (pSVar10->name)._M_string_length);
        local_150 = pSVar10->type;
        iStack_14c = pSVar10->arrayCount;
        local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_170._M_dataplus._M_p,
                   local_170._M_dataplus._M_p + local_170._M_string_length);
        local_100.type = local_150;
        local_100.arrayCount = iStack_14c;
        addUniqueAttribute(this,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
          operator_delete(local_100.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != paVar1) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      pSVar4 = (local_148->textures).
               super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar11 = (local_148->textures).
                     super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar11 != pSVar4;
          pSVar11 = pSVar11 + 1) {
        pcVar2 = (pSVar11->name)._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar2,pcVar2 + (pSVar11->name)._M_string_length);
        local_150 = pSVar11->dim;
        local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_170._M_dataplus._M_p,
                   local_170._M_dataplus._M_p + local_170._M_string_length);
        local_128.dim = local_150;
        addUniqueTexture(this,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
          operator_delete(local_128.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != paVar1) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      pSVar5 = local_148 + 1;
    } while (pSVar5 != local_138);
  }
  if ((this->attributes).
      super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->attributes).
      super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Uh oh... GLProgram has no attributes");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  compileGLProgram(this,local_140);
  setDataLocations(this);
  createBuffers(this);
  checkGLError(true);
  return;
}

Assistant:

GLShaderProgram::GLShaderProgram(const std::vector<ShaderStageSpecification>& stages, DrawMode dm,
                                 unsigned int nPatchVertices)
    : ShaderProgram(stages, dm, nPatchVertices) {

  GLint maxPatchVertices;
  glGetIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
  if (nPatchVertices != 0 && nPatchVertices > (unsigned int)maxPatchVertices) {
    throw std::invalid_argument("Requested number of patch vertices (" + std::to_string(nPatchVertices) +
                                ") is greater than the number supported by the tessellator (" +
                                std::to_string(maxPatchVertices));
  }


  // Collect attributes and uniforms from all of the shaders
  for (const ShaderStageSpecification& s : stages) {
    for (ShaderSpecUniform u : s.uniforms) {
      addUniqueUniform(u);
    }
    for (ShaderSpecAttribute a : s.attributes) {
      addUniqueAttribute(a);
    }
    for (ShaderSpecTexture t : s.textures) {
      addUniqueTexture(t);
    }
  }

  if (attributes.size() == 0) {
    throw std::invalid_argument("Uh oh... GLProgram has no attributes");
  }


  // Perform setup tasks
  compileGLProgram(stages);
  setDataLocations();
  createBuffers();
  checkGLError();
}